

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

void __thiscall
vkb::SwapchainBuilder::add_desired_present_modes
          (SwapchainBuilder *this,vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *modes
          )

{
  VkPresentModeKHR local_10 [2];
  
  local_10[1] = 1;
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::emplace_back<VkPresentModeKHR>
            (modes,local_10 + 1);
  local_10[0] = VK_PRESENT_MODE_FIFO_KHR;
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::emplace_back<VkPresentModeKHR>
            (modes,local_10);
  return;
}

Assistant:

void SwapchainBuilder::add_desired_present_modes(std::vector<VkPresentModeKHR>& modes) const {
    modes.push_back(VK_PRESENT_MODE_MAILBOX_KHR);
    modes.push_back(VK_PRESENT_MODE_FIFO_KHR);
}